

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonEachColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  byte bVar1;
  uint i_00;
  ulong uVar2;
  sqlite3_vtab *psVar3;
  size_t sVar4;
  sqlite3_value **aReplace;
  int *piVar5;
  JsonNode *pNode;
  JsonString x;
  
  if (8 < (uint)i) {
LAB_001ca7e4:
    psVar3 = (sqlite3_vtab *)"$";
    if (cur[5].pVtab != (sqlite3_vtab *)0x0) {
      psVar3 = cur[5].pVtab;
    }
    goto LAB_001ca874;
  }
  i_00 = *(uint *)&cur[2].pVtab;
  uVar2 = (ulong)i_00;
  pNode = (JsonNode *)(&(cur[7].pVtab)->pModule + uVar2 * 2);
  aReplace = (sqlite3_value **)
             ((long)&switchD_001ca72d::switchdataD_001e3228 +
             (long)(int)(&switchD_001ca72d::switchdataD_001e3228)[(uint)i]);
  x.pCtx = ctx;
  switch(i) {
  case 0:
    if (uVar2 == 0) {
      return 0;
    }
    bVar1 = *(byte *)&cur[3].pVtab;
    aReplace = (sqlite3_value **)(ulong)bVar1;
    if (bVar1 == 6) {
      piVar5 = (int *)(cur + 1);
      if (*(char *)((long)&cur[3].pVtab + 1) != '\0') {
        if (*piVar5 == 0) {
          return 0;
        }
        piVar5 = &(cur[7].pVtab)->nRef +
                 (ulong)*(uint *)((long)&(cur[9].pVtab)->pModule + uVar2 * 4) * 4;
      }
      uVar2 = (ulong)(uint)*piVar5;
      goto LAB_001ca8cc;
    }
    if (bVar1 != 7) {
      return 0;
    }
    break;
  case 1:
    pNode = (JsonNode *)((long)&pNode->eType + (ulong)(pNode->jnFlags >> 2 & 0x10));
    break;
  case 2:
    psVar3 = (sqlite3_vtab *)
             jsonType[*(byte *)((long)&pNode->eType + (ulong)(pNode->jnFlags >> 2 & 0x10))];
    goto LAB_001ca874;
  case 3:
    uVar2 = (ulong)(pNode->jnFlags >> 2 & 0x10);
    if (5 < *(byte *)((long)&pNode->eType + uVar2)) {
      return 0;
    }
    pNode = (JsonNode *)((long)&pNode->eType + uVar2);
    break;
  case 4:
    uVar2 = uVar2 + ((pNode->jnFlags >> 6 & 1) != 0);
    goto LAB_001ca8cc;
  case 5:
    if (i_00 <= *(uint *)((long)&cur[1].pVtab + 4)) {
      return 0;
    }
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
      return 0;
    }
    uVar2 = (ulong)*(uint *)((long)&(cur[9].pVtab)->pModule + uVar2 * 4);
LAB_001ca8cc:
    sqlite3_result_int64(ctx,uVar2);
    return 0;
  case 6:
    x.zBuf = x.zSpace;
    x.nAlloc = 100;
    x.nUsed = 0;
    x.bStatic = '\x01';
    x.bErr = '\0';
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
      psVar3 = cur[5].pVtab;
      if (psVar3 == (sqlite3_vtab *)0x0) {
        jsonAppendChar(&x,'$');
      }
      else {
        sVar4 = strlen((char *)psVar3);
        jsonAppendRaw(&x,(char *)psVar3,(u32)sVar4);
      }
      if (*(char *)&cur[3].pVtab == '\a') {
        jsonPrintf(pNode->n,&x,".%.*s",(ulong)(pNode->n - 2),&((pNode->u).pPatch)->jnFlags);
      }
      else if (*(char *)&cur[3].pVtab == '\x06') {
        jsonPrintf(0x1e,&x,"[%d]",(ulong)*(uint *)&cur[1].pVtab);
      }
    }
    else {
      jsonEachComputePath((JsonEachCursor *)cur,&x,i_00);
    }
LAB_001ca869:
    jsonResult(&x);
    return 0;
  case 7:
    if (*(char *)((long)&cur[3].pVtab + 1) != '\0') {
      x.zBuf = x.zSpace;
      x.nAlloc = 100;
      x.nUsed = 0;
      x.bStatic = '\x01';
      x.bErr = '\0';
      jsonEachComputePath((JsonEachCursor *)cur,&x,
                          *(u32 *)((long)&(cur[9].pVtab)->pModule + uVar2 * 4));
      goto LAB_001ca869;
    }
    goto LAB_001ca7e4;
  case 8:
    psVar3 = cur[8].pVtab;
LAB_001ca874:
    sqlite3_result_text(ctx,(char *)psVar3,-1,(_func_void_void_ptr *)0x0);
    return 0;
  }
  jsonReturn(pNode,ctx,aReplace);
  return 0;
}

Assistant:

static int jsonEachColumn(
  sqlite3_vtab_cursor *cur,   /* The cursor */
  sqlite3_context *ctx,       /* First argument to sqlite3_result_...() */
  int i                       /* Which column to return */
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  JsonNode *pThis = &p->sParse.aNode[p->i];
  switch( i ){
    case JEACH_KEY: {
      if( p->i==0 ) break;
      if( p->eType==JSON_OBJECT ){
        jsonReturn(pThis, ctx, 0);
      }else if( p->eType==JSON_ARRAY ){
        u32 iKey;
        if( p->bRecursive ){
          if( p->iRowid==0 ) break;
          iKey = p->sParse.aNode[p->sParse.aUp[p->i]].u.iKey;
        }else{
          iKey = p->iRowid;
        }
        sqlite3_result_int64(ctx, (sqlite3_int64)iKey);
      }
      break;
    }
    case JEACH_VALUE: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      jsonReturn(pThis, ctx, 0);
      break;
    }
    case JEACH_TYPE: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      sqlite3_result_text(ctx, jsonType[pThis->eType], -1, SQLITE_STATIC);
      break;
    }
    case JEACH_ATOM: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      if( pThis->eType>=JSON_ARRAY ) break;
      jsonReturn(pThis, ctx, 0);
      break;
    }
    case JEACH_ID: {
      sqlite3_result_int64(ctx, 
         (sqlite3_int64)p->i + ((pThis->jnFlags & JNODE_LABEL)!=0));
      break;
    }
    case JEACH_PARENT: {
      if( p->i>p->iBegin && p->bRecursive ){
        sqlite3_result_int64(ctx, (sqlite3_int64)p->sParse.aUp[p->i]);
      }
      break;
    }
    case JEACH_FULLKEY: {
      JsonString x;
      jsonInit(&x, ctx);
      if( p->bRecursive ){
        jsonEachComputePath(p, &x, p->i);
      }else{
        if( p->zRoot ){
          jsonAppendRaw(&x, p->zRoot, (int)strlen(p->zRoot));
        }else{
          jsonAppendChar(&x, '$');
        }
        if( p->eType==JSON_ARRAY ){
          jsonPrintf(30, &x, "[%d]", p->iRowid);
        }else if( p->eType==JSON_OBJECT ){
          jsonPrintf(pThis->n, &x, ".%.*s", pThis->n-2, pThis->u.zJContent+1);
        }
      }
      jsonResult(&x);
      break;
    }
    case JEACH_PATH: {
      if( p->bRecursive ){
        JsonString x;
        jsonInit(&x, ctx);
        jsonEachComputePath(p, &x, p->sParse.aUp[p->i]);
        jsonResult(&x);
        break;
      }
      /* For json_each() path and root are the same so fall through
      ** into the root case */
    }
    default: {
      const char *zRoot = p->zRoot;
      if( zRoot==0 ) zRoot = "$";
      sqlite3_result_text(ctx, zRoot, -1, SQLITE_STATIC);
      break;
    }
    case JEACH_JSON: {
      assert( i==JEACH_JSON );
      sqlite3_result_text(ctx, p->sParse.zJson, -1, SQLITE_STATIC);
      break;
    }
  }
  return SQLITE_OK;
}